

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::
GenerateSerializeWithCachedSizesToArray(RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "for (unsigned int i = 0, n = this->$name$_size(); i < n; i++) {\n  target = ::google::protobuf::internal::WireFormatLite::\n    InternalWrite$declared_type$NoVirtualToArray(\n      $number$, this->$name$(i), deterministic, target);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) const {
  printer->Print(variables_,
    "for (unsigned int i = 0, n = this->$name$_size(); i < n; i++) {\n"
    "  target = ::google::protobuf::internal::WireFormatLite::\n"
    "    InternalWrite$declared_type$NoVirtualToArray(\n"
    "      $number$, this->$name$(i), deterministic, target);\n"
    "}\n");
}